

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MS3DImporter::CollectChildJoints
          (MS3DImporter *this,
          vector<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
          *joints,aiNode *nd)

{
  vector<bool,_std::allocator<bool>_> hadit;
  aiMatrix4x4 trafo;
  allocator_type local_91;
  _Bvector_base<std::allocator<bool>_> local_90;
  aiMatrix4x4 local_68;
  
  local_68.a1 = (float)((uint)local_68.a1 & 0xffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_90,
             ((long)(joints->
                    super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(joints->
                   super__Vector_base<Assimp::MS3DImporter::TempJoint,_std::allocator<Assimp::MS3DImporter::TempJoint>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0xb0,(bool *)&local_68,&local_91);
  local_68.a1 = 1.0;
  local_68.a2 = 0.0;
  local_68.a3 = 0.0;
  local_68.a4 = 0.0;
  local_68.b1 = 0.0;
  local_68.b2 = 1.0;
  local_68.b3 = 0.0;
  local_68.b4 = 0.0;
  local_68.c1 = 0.0;
  local_68.c2 = 0.0;
  local_68.c3 = 1.0;
  local_68.c4 = 0.0;
  local_68.d1 = 0.0;
  local_68.d2 = 0.0;
  local_68.d3 = 0.0;
  local_68.d4 = 1.0;
  CollectChildJoints(this,joints,(vector<bool,_std::allocator<bool>_> *)&local_90,nd,&local_68);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_90);
  return;
}

Assistant:

void MS3DImporter :: CollectChildJoints(const std::vector<TempJoint>& joints, aiNode* nd)
{
     std::vector<bool> hadit(joints.size(),false);
     aiMatrix4x4 trafo;

     CollectChildJoints(joints,hadit,nd,trafo);
}